

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

Error asmjit::v1_14::Formatter::formatLabel
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,uint32_t labelId)

{
  CodeHolder *pCVar1;
  long lVar2;
  long lVar3;
  Error EVar4;
  ulong uVar5;
  char *pcVar6;
  
  if ((emitter == (BaseEmitter *)0x0) || (pCVar1 = emitter->_code, pCVar1 == (CodeHolder *)0x0)) {
LAB_0011e02b:
    pcVar6 = "L%u";
    goto LAB_0011e03b;
  }
  if (labelId < *(uint *)&pCVar1->field_0x100) {
    lVar2 = *(long *)(*(long *)&pCVar1->_labelEntries + (ulong)labelId * 8);
    if (lVar2 != 0) {
      if (*(int *)(lVar2 + 0x30) == 0) goto LAB_0011e02b;
      uVar5 = (ulong)*(uint *)(lVar2 + 0x14);
      if (uVar5 == 0xffffffff) goto LAB_0011e09c;
      if ((*(uint *)(lVar2 + 0x14) < *(uint *)&pCVar1->field_0x100) &&
         (lVar3 = *(long *)(*(long *)&pCVar1->_labelEntries + uVar5 * 8), lVar3 != 0)) {
        if (*(uint *)(lVar3 + 0x30) == 0) {
          pcVar6 = "L%u";
          goto LAB_0011e061;
        }
        if (*(uint *)(lVar3 + 0x30) < 0xc) {
          pcVar6 = (char *)(lVar3 + 0x34);
        }
        else {
          pcVar6 = *(char **)(lVar3 + 0x38);
        }
        EVar4 = String::_opString(sb,kAppend,pcVar6,0xffffffffffffffff);
      }
      else {
        pcVar6 = "<InvalidLabel:%u>";
        uVar5 = (ulong)labelId;
LAB_0011e061:
        EVar4 = String::_opFormat(sb,kAppend,pcVar6,uVar5);
      }
      if (EVar4 != 0) {
        return EVar4;
      }
      EVar4 = String::_opChar(sb,kAppend,'.');
      if (EVar4 != 0) {
        return EVar4;
      }
LAB_0011e09c:
      if ((*(char *)(lVar2 + 0x10) == '\0') &&
         (EVar4 = String::_opFormat(sb,kAppend,"L%u@",(ulong)labelId), EVar4 != 0)) {
        return EVar4;
      }
      if (*(uint *)(lVar2 + 0x30) < 0xc) {
        pcVar6 = (char *)(lVar2 + 0x34);
      }
      else {
        pcVar6 = *(char **)(lVar2 + 0x38);
      }
      EVar4 = String::_opString(sb,kAppend,pcVar6,0xffffffffffffffff);
      return EVar4;
    }
  }
  pcVar6 = "<InvalidLabel:%u>";
LAB_0011e03b:
  EVar4 = String::_opFormat(sb,kAppend,pcVar6,(ulong)labelId);
  return EVar4;
}

Assistant:

Error formatLabel(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  uint32_t labelId) noexcept {

  DebugUtils::unused(formatFlags);

  if (emitter && emitter->code()) {
    const LabelEntry* le = emitter->code()->labelEntry(labelId);
    if (ASMJIT_UNLIKELY(!le))
      return sb.appendFormat("<InvalidLabel:%u>", labelId);

    if (le->hasName()) {
      if (le->hasParent()) {
        uint32_t parentId = le->parentId();
        const LabelEntry* pe = emitter->code()->labelEntry(parentId);

        if (ASMJIT_UNLIKELY(!pe))
          ASMJIT_PROPAGATE(sb.appendFormat("<InvalidLabel:%u>", labelId));
        else if (ASMJIT_UNLIKELY(!pe->hasName()))
          ASMJIT_PROPAGATE(sb.appendFormat("L%u", parentId));
        else
          ASMJIT_PROPAGATE(sb.append(pe->name()));

        ASMJIT_PROPAGATE(sb.append('.'));
      }

      if (le->type() == LabelType::kAnonymous)
        ASMJIT_PROPAGATE(sb.appendFormat("L%u@", labelId));
      return sb.append(le->name());
    }
  }

  return sb.appendFormat("L%u", labelId);
}